

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

bool __thiscall QPDF::findStartxref(QPDF *this)

{
  bool bVar1;
  pointer pMVar2;
  element_type *peVar3;
  element_type *this_00;
  qpdf_offset_t qVar4;
  bool local_13a;
  Token local_120;
  allocator<char> local_a1;
  string local_a0;
  Token local_80;
  QPDF *local_18;
  QPDF *this_local;
  
  local_18 = this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &pMVar2->file);
  readToken(&local_80,this,peVar3,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"startxref",&local_a1);
  bVar1 = QPDFTokenizer::Token::isWord(&local_80,&local_a0);
  local_13a = false;
  if (bVar1) {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar2->file);
    readToken(&local_120,this,peVar3,0);
    local_13a = QPDFTokenizer::Token::isInteger(&local_120);
    QPDFTokenizer::Token::~Token(&local_120);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  QPDFTokenizer::Token::~Token(&local_80);
  if (local_13a != false) {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar2->file);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    this_00 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar2->file);
    qVar4 = InputSource::getLastOffset(this_00);
    (*peVar3->_vptr_InputSource[5])(peVar3,qVar4,0);
  }
  return local_13a != false;
}

Assistant:

bool
QPDF::findStartxref()
{
    if (readToken(*m->file).isWord("startxref") && readToken(*m->file).isInteger()) {
        // Position in front of offset token
        m->file->seek(m->file->getLastOffset(), SEEK_SET);
        return true;
    }
    return false;
}